

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O0

void __thiscall leveldb::MemEnvTest_Misc_Test::~MemEnvTest_Misc_Test(MemEnvTest_Misc_Test *this)

{
  MemEnvTest_Misc_Test *this_local;
  
  ~MemEnvTest_Misc_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MemEnvTest, Misc) {
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  ASSERT_TRUE(!test_dir.empty());

  WritableFile* writable_file;
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/a/b", &writable_file));

  // These are no-ops, but we test they return success.
  ASSERT_LEVELDB_OK(writable_file->Sync());
  ASSERT_LEVELDB_OK(writable_file->Flush());
  ASSERT_LEVELDB_OK(writable_file->Close());
  delete writable_file;
}